

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall cmQtAutoGenInitializer::AddCleanFile(cmQtAutoGenInitializer *this,string *fileName)

{
  cmTarget *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = this->Target->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ADDITIONAL_CLEAN_FILES",&local_39);
  cmTarget::AppendProperty(this_00,&local_38,(fileName->_M_dataplus)._M_p,false);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCleanFile(std::string const& fileName)
{
  Target->Target->AppendProperty("ADDITIONAL_CLEAN_FILES", fileName.c_str(),
                                 false);
}